

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

void __thiscall
IMLE<1,_1,_FastLinearExpert>::getForwardSolutions(IMLE<1,_1,_FastLinearExpert> *this)

{
  reference pFVar1;
  Scalar *pSVar2;
  reference piVar3;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *this_00;
  long in_RDI;
  Scal SVar4;
  Scal SVar5;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *pMVar6;
  int k;
  int j;
  ArrayX sumInvRxj;
  ArrayX sumInvRj;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
  *in_stack_fffffffffffffd18;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_fffffffffffffd20;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffd28;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffd30;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  *in_stack_fffffffffffffd38;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffd40;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffd48;
  value_type *in_stack_fffffffffffffd50;
  size_type in_stack_fffffffffffffd58;
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  *in_stack_fffffffffffffd60;
  int local_204;
  int local_48;
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  local_38;
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  local_20;
  
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::vector(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::vector(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::clear((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           *)0x2a346c);
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::clear((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           *)0x2a3482);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x2a3498);
  for (local_48 = 0; local_48 < *(int *)(in_RDI + 0xb0); local_48 = local_48 + 1) {
    pFVar1 = std::
             vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                           *)(in_RDI + 0x98),(long)local_48);
    SVar4 = LinearExpert<1,_1>::getGamma(&pFVar1->super_LinearExpert<1,_1>);
    pFVar1 = std::
             vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                           *)(in_RDI + 0x98),(long)local_48);
    SVar5 = LinearExpert<1,_1>::get_p_z(&pFVar1->super_LinearExpert<1,_1>);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x110),(long)local_48);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_fffffffffffffd20,(Index)in_stack_fffffffffffffd18);
    pMVar6 = (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)(SVar4 * SVar5 + *pSVar2);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_stack_fffffffffffffd20,(Index)in_stack_fffffffffffffd18);
    *pSVar2 = (Scalar)pMVar6;
    in_stack_fffffffffffffd48 = (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)(in_RDI + 0x98)
    ;
    pFVar1 = std::
             vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                           *)in_stack_fffffffffffffd48,(long)local_48);
    LinearExpert<1,_1>::getPredXInvVar(&pFVar1->super_LinearExpert<1,_1>);
    pFVar1 = std::
             vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                           *)in_stack_fffffffffffffd48,(long)local_48);
    LinearExpert<1,_1>::get_p_z(&pFVar1->super_LinearExpert<1,_1>);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_stack_fffffffffffffd20,(Index)in_stack_fffffffffffffd18);
    Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator*(pMVar6,pSVar2);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_fffffffffffffd30,(Index)in_stack_fffffffffffffd28);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
               in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_fffffffffffffd30,(Index)in_stack_fffffffffffffd28);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
    asDiagonal((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
               in_stack_fffffffffffffd20);
    pFVar1 = std::
             vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                           *)(in_RDI + 0x98),(long)local_48);
    LinearExpert<1,_1>::getPredX(&pFVar1->super_LinearExpert<1,_1>);
    Eigen::
    DiagonalBase<Eigen::DiagonalWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>const>>
    ::operator*((DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                 *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_fffffffffffffd30,(Index)in_stack_fffffffffffffd28);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
               in_stack_fffffffffffffd20,
               (DenseBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>_>
                *)in_stack_fffffffffffffd18);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_fffffffffffffd30,(Index)in_stack_fffffffffffffd28);
    piVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x110),(long)local_48);
    std::
    vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ::operator[](&local_20,(long)*piVar3);
    Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator+=
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_fffffffffffffd30,(Index)in_stack_fffffffffffffd28);
    piVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x110),(long)local_48);
    std::
    vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ::operator[](&local_38,(long)*piVar3);
    Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator+=
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  }
  for (local_204 = 0; local_204 < *(int *)(in_RDI + 0x254); local_204 = local_204 + 1) {
    pMVar6 = (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
             Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_stack_fffffffffffffd20,(Index)in_stack_fffffffffffffd18);
    if ((*(double *)pMVar6 != 0.0) || (NAN(*(double *)pMVar6))) {
      in_stack_fffffffffffffd30 =
           (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(in_RDI + 0x1a8);
      this_00 = (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                std::
                vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                ::operator[](&local_38,(long)local_204);
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::operator[](&local_20,(long)local_204);
      Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::
      cwiseQuotient<Eigen::Matrix<double,1,1,0,1,1>>(in_stack_fffffffffffffd48,pMVar6);
      Eigen::Matrix<double,1,1,0,1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::Matrix<double,1,1,0,1,1>const>>
                ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffd20,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                  *)in_stack_fffffffffffffd18);
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::push_back((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                   *)in_stack_fffffffffffffd30,(value_type *)in_stack_fffffffffffffd28);
      in_stack_fffffffffffffd28 =
           (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)(in_RDI + 0x1c0);
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::operator[](&local_20,(long)local_204);
      Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::cwiseInverse(this_00);
      Eigen::Matrix<double,1,1,0,1,1>::
      Matrix<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>>
                ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffd20,
                 (EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                  *)in_stack_fffffffffffffd18);
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::push_back((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                   *)in_stack_fffffffffffffd30,(value_type *)in_stack_fffffffffffffd28);
      in_stack_fffffffffffffd18 =
           (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
            *)(in_RDI + 0x1d8);
      in_stack_fffffffffffffd20 =
           (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     (in_stack_fffffffffffffd20,(Index)in_stack_fffffffffffffd18);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd30,
                 (value_type_conflict *)in_stack_fffffffffffffd28);
    }
    else {
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::push_back((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                   *)in_stack_fffffffffffffd30,(value_type *)in_stack_fffffffffffffd28);
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::push_back((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                   *)in_stack_fffffffffffffd30,(value_type *)in_stack_fffffffffffffd28);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd30,
                 (value_type_conflict *)in_stack_fffffffffffffd28);
    }
  }
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             *)0x2a3aaa);
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             *)0x2a3ab9);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::getForwardSolutions()
{
    // Aux variables
    ArrayX sumInvRj(nSolFound, zeroX);
    ArrayX sumInvRxj(nSolFound, zeroX);

    // Clear predict data structure
    predictions.clear();
    predictionsVar.clear();
    predictionsWeight.clear();

    for(int j = 0; j < M; j++)
    {
        /* These 3 variables have already been resized in predict() */
        varPhiAuxj(j) = experts[j].getGamma() * experts[j].get_p_z() + sumW[sNearest[j]];
        fInvRj.col(j) = experts[j].getPredXInvVar() * (experts[j].get_p_z() / varPhiAuxj(j));
        invRxj.col(j) = fInvRj.col(j).asDiagonal() * experts[j].getPredX();

        sumInvRj[sNearest[j]] += fInvRj.col(j);
        sumInvRxj[sNearest[j]] += invRxj.col(j);
    }

    // Update storage results
    for( int k = 0; k < nSolFound; k++ )
    {
        if(sum_p_z(k) == 0.0)  // Not likely, but...
        {
            predictions.push_back( zeroX );
            predictionsVar.push_back( infinityX );
            predictionsWeight.push_back( 0.0 );
        }
        else
        {
            predictions.push_back( sumInvRxj[k].cwiseQuotient(sumInvRj[k]) );
            predictionsVar.push_back( sumInvRj[k].cwiseInverse() );
            predictionsWeight.push_back( sum_p_z(k) / sumAll );
        }
    }
}